

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_substr(vm_val_t *retval,vm_val_t *self_val,char *str,uint *in_argc)

{
  char *pcVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  utf8_ptr str_00;
  int iVar5;
  int32_t iVar6;
  int32_t iVar7;
  vm_obj_id_t vVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  bool bVar12;
  size_t rem;
  utf8_ptr p;
  
  p.p_ = (char *)0x0;
  if (in_argc == (uint *)0x0) {
    bVar12 = false;
  }
  else {
    bVar12 = 1 < *in_argc;
  }
  if ((getp_substr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar5 = __cxa_guard_acquire(&getp_substr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar5 != 0)) {
    getp_substr::desc.min_argc_ = 1;
    getp_substr::desc.opt_argc_ = 1;
    getp_substr::desc.varargs_ = 0;
    __cxa_guard_release(&getp_substr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_substr::desc);
  if (iVar5 == 0) {
    iVar6 = CVmBif::pop_long_val();
    if (bVar12) {
      iVar7 = CVmBif::pop_long_val();
      lVar9 = (long)iVar7;
    }
    else {
      lVar9 = 0;
    }
    pvVar4 = sp_;
    lVar10 = (long)iVar6;
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    pcVar1 = str + 2;
    rem = (size_t)*(ushort *)str;
    p.p_ = pcVar1;
    if (iVar6 < 1) {
      if (iVar6 < 0) {
        p.p_ = pcVar1 + rem;
        rem = 0;
        while ((lVar10 < 0 && (p.p_ != pcVar1))) {
          utf8_ptr::dec(&p,&rem);
          lVar10 = lVar10 + 1;
        }
      }
    }
    else {
      while ((1 < lVar10 && (rem != 0))) {
        utf8_ptr::inc(&p,&rem);
        lVar10 = lVar10 + -1;
      }
    }
    str_00.p_ = p.p_;
    sVar11 = rem;
    if (bVar12) {
      if (lVar9 < 0) {
        p.p_ = p.p_ + rem;
        rem = 0;
        while ((lVar9 < 0 && (rem < sVar11))) {
          utf8_ptr::dec(&p,&rem);
          lVar9 = lVar9 + 1;
        }
      }
      else {
        while ((0 < lVar9 && (rem != 0))) {
          utf8_ptr::inc(&p,&rem);
          lVar9 = lVar9 + -1;
        }
      }
      sVar11 = sVar11 - rem;
    }
    vVar8 = create(0,str_00.p_,sVar11);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar8;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_substr(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                              const char *str, uint *in_argc)
{
    long start;
    long len = 0;
    size_t rem;
    utf8_ptr p;
    utf8_ptr start_p;
    size_t start_rem;
    size_t new_len;
    vm_obj_id_t obj;

    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* pop the starting index */
    start = CVmBif::pop_long_val(vmg0_);

    /* pop the length, if present */
    if (argc >= 2)
        len = CVmBif::pop_long_val(vmg0_);

    /* push a self-reference to protect against GC */
    G_stk->push(self_val);

    /* set up a utf8 pointer to traverse the string */
    p.set((char *)str + VMB_LEN);

    /* get the byte length of the string */
    rem = vmb_get_len(str);

    /* 
     *   Skip ahead to the starting index.  If the index is positive, it's
     *   an index from the start of the string; if it's negative, it's an
     *   offset from the end of the string.  
     */
    if (start > 0)
    {
        /* 
         *   it's an index from the start - skip ahead by start-1 characters
         *   (since a start value of 1 tells us to start at the first
         *   character) 
         */
        for ( ; start > 1 && rem != 0 ; --start)
            p.inc(&rem);
    }
    else if (start < 0)
    {
        /*
         *   It's an index from the end of the string: -1 tells us to start
         *   at the last character, -2 at the second to last, and so on.
         *   Move to the first byte past the end of the string, and work
         *   backwards by the given number of characters.  
         */
        for (p.set((char *)str + VMB_LEN + rem), rem = 0 ;
             start < 0 && p.getptr() != (char *)str + VMB_LEN ; ++start)
        {
            /* move back one character */
            p.dec(&rem);
        }
    }

    /* this is the starting position */
    start_p = p;
    start_rem = rem;

    /* 
     *   if a length was specified, calculate the number of bytes in the
     *   given length; otherwise, use the entire remainder of the string 
     */
    if (argc >= 2)
    {
        /* figure the positive or negative length */
        if (len >= 0)
        {
            /* 
             *   Positive length - this specifies the number of characters to
             *   keep starting at the starting index.  Skip ahead by the
             *   desired length to figure the end pointer. 
             */
            for ( ; len > 0 && rem != 0 ; --len)
                p.inc(&rem);
        }
        else
        {
            /*
             *   Negative length - this specifies the number of characters to
             *   remove from the end of the string.  Move to the end of the
             *   string, then skip back by |len| characters to find the end
             *   pointer.  
             */
            for (p.set(p.getptr() + rem), rem = 0 ;
                 len < 0 && rem < start_rem ; ++len)
                 p.dec(&rem);
        }

        /* use the difference in lengths from the starting point to here */
        new_len = start_rem - rem;
    }
    else
    {
        /* use the entire remainder of the string */
        new_len = start_rem;
    }

    /* create the new string */
    obj = CVmObjString::create(vmg_ FALSE, start_p.getptr(), new_len);

    /* return the new object */
    retval->set_obj(obj);

    /* discard the GC protection references */
    G_stk->discard();

    /* handled */
    return TRUE;
}